

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::ByteCodeWriter::TryWriteReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot R0)

{
  bool bVar1;
  undefined2 local_1a [4];
  OpLayoutT_Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  bVar1 = DAT_015b5fbd == '\0';
  if (bVar1) {
    local_1a[0] = (undefined2)R0;
  }
  if (bVar1 && R0 < 0x10000) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,local_1a,2);
  }
  return bVar1 && R0 < 0x10000;
}

Assistant:

bool ByteCodeWriter::TryWriteReg1(OpCode op, RegSlot R0)
    {
        OpLayoutT_Reg1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }